

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,OpenMode modes)

{
  Stream *pSVar1;
  iterator iVar2;
  iterator iVar3;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *this;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  this = (QDebug *)
         CONCAT44(in_register_00000034,
                  modes.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::operator<<(this,"OpenMode(");
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  local_48.size = 0;
  if (in_EDX == 0) {
    latin1_05.m_data = "NotOpen";
    latin1_05.m_size = 7;
    QString::QString((QString *)&local_60,latin1_05);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
  }
  else {
    if ((in_EDX & 1) != 0) {
      latin1.m_data = "ReadOnly";
      latin1.m_size = 8;
      QString::QString((QString *)&local_60,latin1);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 2) != 0) {
      latin1_00.m_data = "WriteOnly";
      latin1_00.m_size = 9;
      QString::QString((QString *)&local_60,latin1_00);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 4) != 0) {
      latin1_01.m_data = "Append";
      latin1_01.m_size = 6;
      QString::QString((QString *)&local_60,latin1_01);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 8) != 0) {
      latin1_02.m_data = "Truncate";
      latin1_02.m_size = 8;
      QString::QString((QString *)&local_60,latin1_02);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 0x10) != 0) {
      latin1_03.m_data = "Text";
      latin1_03.m_size = 4;
      QString::QString((QString *)&local_60,latin1_03);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if ((in_EDX & 0x20) == 0) goto LAB_0022c556;
    latin1_04.m_data = "Unbuffered";
    latin1_04.m_size = 10;
    QString::QString((QString *)&local_60,latin1_04);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
LAB_0022c556:
  iVar2 = QList<QString>::begin((QList<QString> *)&local_48);
  iVar3 = QList<QString>::end((QList<QString> *)&local_48);
  std::__sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar2.i,iVar3.i);
  QListSpecialMethods<QString>::join
            ((QString *)&local_60,(QListSpecialMethods<QString> *)&local_48,(QChar)0x7c);
  QDebug::operator<<(this,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QDebug::operator<<(this,')');
  pSVar1 = this->stream;
  this->stream = (Stream *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar1;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QIODevice::OpenMode modes)
{
    debug << "OpenMode(";
    QStringList modeList;
    if (modes == QIODevice::NotOpen) {
        modeList << "NotOpen"_L1;
    } else {
        if (modes & QIODevice::ReadOnly)
            modeList << "ReadOnly"_L1;
        if (modes & QIODevice::WriteOnly)
            modeList << "WriteOnly"_L1;
        if (modes & QIODevice::Append)
            modeList << "Append"_L1;
        if (modes & QIODevice::Truncate)
            modeList << "Truncate"_L1;
        if (modes & QIODevice::Text)
            modeList << "Text"_L1;
        if (modes & QIODevice::Unbuffered)
            modeList << "Unbuffered"_L1;
    }
    std::sort(modeList.begin(), modeList.end());
    debug << modeList.join(u'|');
    debug << ')';
    return debug;
}